

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent(QGraphicsSceneWheelEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *pQVar1;
  
  pQVar1 = (QGraphicsSceneEventPrivate *)operator_new(0x68);
  pQVar1->widget = (QWidget *)0x0;
  pQVar1->q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1->timestamp = 0;
  pQVar1->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_00813ed0
  ;
  pQVar1[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[1].widget = (QWidget *)0x0;
  pQVar1[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1[1].timestamp = 0;
  pQVar1[2]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[2].widget = (QWidget *)0x0;
  *(undefined8 *)((long)&pQVar1[2].widget + 4) = 0;
  *(undefined8 *)((long)&pQVar1[2].q_ptr + 4) = 0;
  *(undefined8 *)((long)&pQVar1[2].timestamp + 4) = 1;
  *(undefined1 *)((long)&pQVar1[3]._vptr_QGraphicsSceneEventPrivate + 4) = 0;
  QEvent::QEvent((QEvent *)this,type);
  (this->super_QGraphicsSceneEvent).d_ptr.d = pQVar1;
  pQVar1->q_ptr = &this->super_QGraphicsSceneEvent;
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_00813c40;
  return;
}

Assistant:

QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneWheelEventPrivate, type)
{
}